

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * local_store_declaration
                    (gravity_parser_t *parser,char *identifier,char *annotation_type,
                    gtoken_t access_specifier,gtoken_t storage_specifier,gnode_t *declaration)

{
  size_t sVar1;
  gnode_r *declarations;
  gnode_variable_decl_t *vdecl_00;
  gnode_t *pgVar2;
  gnode_t **ppgVar3;
  size_t local_a0;
  gnode_t *local_98;
  char *local_78;
  gnode_t *local_68;
  gnode_t *decl;
  gnode_variable_decl_t *vdecl;
  gnode_r *decls;
  gnode_t *declaration_local;
  gtoken_t storage_specifier_local;
  gtoken_t access_specifier_local;
  char *annotation_type_local;
  char *identifier_local;
  gravity_parser_t *parser_local;
  
  declarations = gnode_array_create();
  if (parser->declarations->n == 0) {
    local_68 = (gnode_t *)0x0;
  }
  else {
    local_68 = parser->declarations->p[parser->declarations->n - 1];
  }
  vdecl_00 = (gnode_variable_decl_t *)
             gnode_variable_decl_create
                       (declaration->token,TOK_KEY_VAR,access_specifier,storage_specifier,
                        declarations,local_68);
  if (identifier == (char *)0x0) {
    local_78 = (char *)0x0;
  }
  else {
    local_78 = string_dup(identifier);
  }
  if (parser->declarations->n == 0) {
    local_98 = (gnode_t *)0x0;
  }
  else {
    local_98 = parser->declarations->p[parser->declarations->n - 1];
  }
  pgVar2 = gnode_variable_create
                     (declaration->token,local_78,annotation_type,declaration,local_98,vdecl_00);
  if (declarations->n == declarations->m) {
    if (declarations->m == 0) {
      local_a0 = 8;
    }
    else {
      local_a0 = declarations->m << 1;
    }
    declarations->m = local_a0;
    ppgVar3 = (gnode_t **)realloc(declarations->p,declarations->m << 3);
    declarations->p = ppgVar3;
  }
  sVar1 = declarations->n;
  declarations->n = sVar1 + 1;
  declarations->p[sVar1] = pgVar2;
  return &vdecl_00->base;
}

Assistant:

static gnode_t *local_store_declaration (gravity_parser_t *parser, const char *identifier, const char *annotation_type, gtoken_t access_specifier, gtoken_t storage_specifier, gnode_t *declaration) {
    gnode_r *decls = gnode_array_create();
    
    gnode_variable_decl_t *vdecl = (gnode_variable_decl_t *)gnode_variable_decl_create(declaration->token, TOK_KEY_VAR, access_specifier, storage_specifier, decls, LAST_DECLARATION());
    gnode_t *decl = gnode_variable_create(declaration->token, identifier ? string_dup(identifier) : NULL, annotation_type, declaration, LAST_DECLARATION(), vdecl);
    gnode_array_push(decls, decl);
    
    return (gnode_t *)vdecl;
}